

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O1

void Init::reflectVector<Init::DocumentFilter>
               (StringWriter *writer,string *name,
               vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_> *list,
               bool skipIfEmpty)

{
  pointer pDVar1;
  undefined7 in_register_00000009;
  DocumentFilter *elem;
  pointer pDVar2;
  
  if (((int)CONCAT71(in_register_00000009,skipIfEmpty) != 0) &&
     ((list->super__Vector_base<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (list->super__Vector_base<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    return;
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(writer,(name->_M_dataplus)._M_p,(SizeType)name->_M_string_length,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(writer);
  pDVar1 = (list->super__Vector_base<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pDVar2 = (list->
                super__Vector_base<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>).
                _M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1) {
    (**(pDVar2->super_Reflectable)._vptr_Reflectable)(pDVar2);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(writer,0);
  return;
}

Assistant:

void reflectVector (StringWriter &writer, const string &name, vector<T> &list, bool skipIfEmpty = true) {
        if (skipIfEmpty && list.empty()) return;

        writer.Key(name);
        writer.StartArray();
        for (T &elem : list) {
            elem.reflect(writer);
        }
        writer.EndArray();
    }